

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O2

ArenaMemoryData * MemoryProfiler::Begin(LPCWSTR name)

{
  ArenaMemoryData *pAVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  MemoryProfiler *pMVar6;
  ArenaMemoryData *pAVar7;
  LPCWSTR local_38;
  ArenaMemoryDataSummary *local_30;
  ArenaMemoryDataSummary *arenaTotalMemoryData;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  bVar3 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,TraceMemoryFlag);
  if (bVar3) {
    if (name == (LPCWSTR)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
                         ,0x5f,"(name != nullptr)","name != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    iVar4 = PAL_wcscmp(name,L"MemoryProfiler");
    if (iVar4 != 0) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)((long)&arenaTotalMemoryData + 4),
                 ExceptionType_DisableCheck);
      pMVar6 = EnsureMemoryProfiler();
      local_38 = name;
      bVar3 = JsUtil::
              BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<char16_t*>
                        ((BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)&pMVar6->arenaDataMap,&local_38,&local_30);
      if (!bVar3) {
        local_30 = (ArenaMemoryDataSummary *)
                   new<Memory::ArenaAllocator>(0xd8,&pMVar6->alloc,0x35b3c0);
        local_38 = name;
        JsUtil::
        BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)&pMVar6->arenaDataMap,&local_38,&local_30);
      }
      local_30->arenaCount = local_30->arenaCount + 1;
      pAVar7 = (ArenaMemoryData *)new<Memory::ArenaAllocator>(0x60,&pMVar6->alloc,0x35b3c0);
      pAVar1 = local_30->data;
      if (pAVar1 != (ArenaMemoryData *)0x0) {
        pAVar7->next = pAVar1;
        pAVar1->prev = pAVar7;
      }
      local_30->data = pAVar7;
      pAVar7->profiler = pMVar6;
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)((long)&arenaTotalMemoryData + 4));
      return pAVar7;
    }
  }
  return (ArenaMemoryData *)0x0;
}

Assistant:

ArenaMemoryData *
MemoryProfiler::Begin(LPCWSTR name)
{
    if (!Js::Configuration::Global.flags.IsEnabled(Js::TraceMemoryFlag))
    {
        return nullptr;
    }
    Assert(name != nullptr);
    if (wcscmp(name, _u("MemoryProfiler")) == 0)
    {
        // Don't profile memory profiler itself
        return nullptr;
    }

    // This is debug only code, we don't care if we catch the right exception
    AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
    MemoryProfiler * memoryProfiler = EnsureMemoryProfiler();
    ArenaMemoryDataSummary * arenaTotalMemoryData;
    if (!memoryProfiler->arenaDataMap.TryGetValue((LPWSTR)name, &arenaTotalMemoryData))
    {
        arenaTotalMemoryData = AnewStructZ(&memoryProfiler->alloc, ArenaMemoryDataSummary);
        memoryProfiler->arenaDataMap.Add((LPWSTR)name, arenaTotalMemoryData);
    }
    arenaTotalMemoryData->arenaCount++;

    ArenaMemoryData * memoryData = AnewStructZ(&memoryProfiler->alloc, ArenaMemoryData);
    if (arenaTotalMemoryData->data == nullptr)
    {
        arenaTotalMemoryData->data = memoryData;
    }
    else
    {
        memoryData->next = arenaTotalMemoryData->data;
        arenaTotalMemoryData->data->prev = memoryData;
        arenaTotalMemoryData->data = memoryData;
    }
    memoryData->profiler = memoryProfiler;
    return memoryData;
}